

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
trieste::Reader::Reader
          (Reader *this,string *language_name,
          vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
          *passes,Parse *parser)

{
  allocator<char> local_36;
  allocator<char> local_35 [13];
  Parse *local_28;
  Parse *parser_local;
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
  *passes_local;
  string *language_name_local;
  Reader *this_local;
  
  local_28 = parser;
  parser_local = (Parse *)passes;
  passes_local = (vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
                  *)language_name;
  language_name_local = (string *)this;
  std::__cxx11::string::string
            ((string *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)language_name);
  CLI::std::
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>::
  vector(&this->passes_,
         (vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
          *)parser_local);
  Parse::Parse(&this->parser_,local_28);
  std::optional<std::variant<std::filesystem::__cxx11::path,_std::shared_ptr<trieste::SourceDef>_>_>
  ::optional((optional<std::variant<std::filesystem::__cxx11::path,_std::shared_ptr<trieste::SourceDef>_>_>
              *)&this->input_);
  this->debug_enabled_ = false;
  this->wf_check_enabled_ = false;
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            ((path *)&this->debug_path_,(char (*) [2])0x38e56f,auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->start_pass_,"",local_35);
  std::allocator<char>::~allocator(local_35);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->end_pass_,"",&local_36);
  std::allocator<char>::~allocator(&local_36);
  this->offset_ = 0;
  return;
}

Assistant:

Reader(
      const std::string& language_name,
      const std::vector<Pass>& passes,
      const Parse& parser)
    : language_name_(language_name),
      passes_(passes),
      parser_(parser),
      debug_enabled_(false),
      wf_check_enabled_(false),
      debug_path_("."),
      start_pass_(""),
      end_pass_(""),
      offset_(0)
    {}